

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O3

int fit_iforest(IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,float *numeric_data,
               size_t ncols_numeric,int *categ_data,size_t ncols_categ,int *ncat,float *Xc,
               int64_t *Xc_ind,int64_t *Xc_indptr,size_t ndim,size_t ntry,CoefType coef_type,
               bool coef_by_prop,float *sample_weights,bool with_replacement,bool weight_as_sample,
               size_t nrows,size_t sample_size,size_t ntrees,size_t max_depth,size_t ncols_per_tree,
               bool limit_depth,bool penalize_range,bool standardize_data,
               ScoringMetric scoring_metric,bool fast_bratio,bool standardize_dist,double *tmat,
               double *output_depths,bool standardize_depth,float *col_weights,bool weigh_by_kurt,
               double prob_pick_by_gain_pl,double prob_pick_by_gain_avg,
               double prob_pick_by_full_gain,double prob_pick_by_dens,double prob_pick_col_by_range,
               double prob_pick_col_by_var,double prob_pick_col_by_kurt,double min_gain,
               MissingAction missing_action,CategSplit cat_split_type,NewCategAction new_cat_action,
               bool all_perm,Imputer *imputer,size_t min_imp_obs,UseDepthImp depth_imp,
               WeighImpRows weigh_imp_rows,bool impute_at_fit,uint64_t random_seed,
               bool use_long_double,int nthreads)

{
  int iVar1;
  
  if (use_long_double) {
    iVar1 = fit_iforest_internal<float,long,long_double>
                      (model_outputs,model_outputs_ext,numeric_data,ncols_numeric,categ_data,
                       ncols_categ,ncat,Xc,Xc_ind,Xc_indptr,ndim,ntry,coef_type,coef_by_prop,
                       sample_weights,with_replacement,weight_as_sample,nrows,sample_size,ntrees,
                       max_depth,ncols_per_tree,limit_depth,penalize_range,standardize_data,
                       scoring_metric,fast_bratio,standardize_dist,tmat,output_depths,
                       standardize_depth,col_weights,weigh_by_kurt,prob_pick_by_gain_pl,
                       prob_pick_by_gain_avg,prob_pick_by_full_gain,prob_pick_by_dens,
                       prob_pick_col_by_range,prob_pick_col_by_var,prob_pick_col_by_kurt,min_gain,
                       missing_action,cat_split_type,new_cat_action,all_perm,imputer,min_imp_obs,
                       depth_imp,weigh_imp_rows,impute_at_fit,random_seed,nthreads);
  }
  else {
    iVar1 = fit_iforest_internal<float,long,double>
                      (model_outputs,model_outputs_ext,numeric_data,ncols_numeric,categ_data,
                       ncols_categ,ncat,Xc,Xc_ind,Xc_indptr,ndim,ntry,coef_type,coef_by_prop,
                       sample_weights,with_replacement,weight_as_sample,nrows,sample_size,ntrees,
                       max_depth,ncols_per_tree,limit_depth,penalize_range,standardize_data,
                       scoring_metric,fast_bratio,standardize_dist,tmat,output_depths,
                       standardize_depth,col_weights,weigh_by_kurt,prob_pick_by_gain_pl,
                       prob_pick_by_gain_avg,prob_pick_by_full_gain,prob_pick_by_dens,
                       prob_pick_col_by_range,prob_pick_col_by_var,prob_pick_col_by_kurt,min_gain,
                       missing_action,cat_split_type,new_cat_action,all_perm,imputer,min_imp_obs,
                       depth_imp,weigh_imp_rows,impute_at_fit,random_seed,nthreads);
  }
  return iVar1;
}

Assistant:

ISOTREE_EXPORTED int fit_iforest(IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                real_t numeric_data[],  size_t ncols_numeric,
                int    categ_data[],    size_t ncols_categ,    int ncat[],
                real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                size_t ndim, size_t ntry, CoefType coef_type, bool coef_by_prop,
                real_t sample_weights[], bool with_replacement, bool weight_as_sample,
                size_t nrows, size_t sample_size, size_t ntrees,
                size_t max_depth,   size_t ncols_per_tree,
                bool   limit_depth, bool penalize_range, bool standardize_data,
                ScoringMetric scoring_metric, bool fast_bratio,
                bool   standardize_dist, double tmat[],
                double output_depths[], bool standardize_depth,
                real_t col_weights[], bool weigh_by_kurt,
                double prob_pick_by_gain_pl, double prob_pick_by_gain_avg,
                double prob_pick_by_full_gain, double prob_pick_by_dens,
                double prob_pick_col_by_range, double prob_pick_col_by_var,
                double prob_pick_col_by_kurt,
                double min_gain, MissingAction missing_action,
                CategSplit cat_split_type, NewCategAction new_cat_action,
                bool   all_perm, Imputer *imputer, size_t min_imp_obs,
                UseDepthImp depth_imp, WeighImpRows weigh_imp_rows, bool impute_at_fit,
                uint64_t random_seed, bool use_long_double, int nthreads)
{
    return fit_iforest<real_t, sparse_ix>
               (model_outputs, model_outputs_ext,
                numeric_data,  ncols_numeric,
                categ_data,    ncols_categ,    ncat,
                Xc, Xc_ind, Xc_indptr,
                ndim, ntry, coef_type, coef_by_prop,
                sample_weights, with_replacement, weight_as_sample,
                nrows, sample_size, ntrees,
                max_depth,   ncols_per_tree,
                limit_depth, penalize_range, standardize_data,
                scoring_metric, fast_bratio,
                standardize_dist, tmat,
                output_depths, standardize_depth,
                col_weights, weigh_by_kurt,
                prob_pick_by_gain_pl, prob_pick_by_gain_avg,
                prob_pick_by_full_gain, prob_pick_by_dens,
                prob_pick_col_by_range, prob_pick_col_by_var,
                prob_pick_col_by_kurt,
                min_gain, missing_action,
                cat_split_type, new_cat_action,
                all_perm, imputer, min_imp_obs,
                depth_imp, weigh_imp_rows, impute_at_fit,
                random_seed, use_long_double, nthreads);
}